

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

ssize_t buffer_find(Buffer *buffer,size_t start,void *_data,size_t len)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  size_t local_80;
  size_t avail;
  size_t itemremain_1;
  size_t retval;
  size_t itemremain;
  uint8 first;
  uint8 *data;
  size_t pos;
  uint8 *ptr;
  BufferBlock *item;
  size_t len_local;
  void *_data_local;
  size_t start_local;
  Buffer *buffer_local;
  
  if (len == 0) {
    buffer_local = (Buffer *)0x0;
  }
  else if (start < buffer->total_bytes) {
    if (buffer->total_bytes - start < len) {
      buffer_local = (Buffer *)0xffffffffffffffff;
    }
    else {
      ptr = (uint8 *)buffer->head;
      pos = (size_t)((BufferBlock *)ptr)->data;
      data = (uint8 *)0x0;
      if (start != 0) {
        while( true ) {
          if (ptr == (uint8 *)0x0) {
            __assert_fail("item != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                          ,0x3d4,
                          "ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)")
            ;
          }
          if (start < data + *(long *)(ptr + 8)) break;
          data = data + *(long *)(ptr + 8);
          ptr = *(uint8 **)(ptr + 0x10);
        }
        pos = *(long *)ptr + (start - (long)data);
      }
      if (ptr == (uint8 *)0x0) {
        __assert_fail("item != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x3e1,
                      "ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)");
      }
      if (pos == 0) {
        __assert_fail("ptr != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                      ,0x3e2,
                      "ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)");
      }
      bVar1 = *_data;
      while (ptr != (uint8 *)0x0) {
        for (pos = (size_t)memchr((void *)pos,(uint)bVar1,*(long *)(ptr + 8) - (pos - *(long *)ptr))
            ; pos != 0; pos = (size_t)memchr((void *)(pos + 1),(uint)bVar1,uVar4 - 1)) {
          lVar2 = *(long *)ptr;
          if (len == 1) {
            return (ssize_t)(data + (pos - lVar2));
          }
          uVar4 = *(long *)(ptr + 8) - (pos - *(long *)ptr);
          local_80 = uVar4;
          if (len < uVar4) {
            local_80 = len;
          }
          if (((local_80 == 0) || (iVar3 = memcmp((void *)pos,_data,local_80), iVar3 == 0)) &&
             (iVar3 = blockscmp(*(BufferBlock **)(ptr + 0x10),(uint8 *)((long)_data + local_80),
                                len - local_80), iVar3 != 0)) {
            return (ssize_t)(data + (pos - lVar2));
          }
        }
        data = data + *(long *)(ptr + 8);
        ptr = *(uint8 **)(ptr + 0x10);
        if ((size_t *)ptr != (size_t *)0x0) {
          pos = *(size_t *)ptr;
        }
      }
      buffer_local = (Buffer *)0xffffffffffffffff;
    }
  }
  else {
    buffer_local = (Buffer *)0xffffffffffffffff;
  }
  return (ssize_t)buffer_local;
}

Assistant:

ssize_t buffer_find(Buffer *buffer, const size_t start,
                    const void *_data, const size_t len)
{
    if (len == 0)
        return 0;  // I guess that's right.

    if (start >= buffer->total_bytes)
        return -1;  // definitely can't match.

    if (len > (buffer->total_bytes - start))
        return -1;  // definitely can't match.

    // Find the start point somewhere in the center of a buffer.
    BufferBlock *item = buffer->head;
    const uint8 *ptr = item->data;
    size_t pos = 0;
    if (start > 0)
    {
        while (1)
        {
            assert(item != NULL);
            if ((pos + item->bytes) > start)  // start is in this block.
            {
                ptr = item->data + (start - pos);
                break;
            } // if

            pos += item->bytes;
            item = item->next;
        } // while
    } // if

    // okay, we're at the origin of the search.
    assert(item != NULL);
    assert(ptr != NULL);

    const uint8 *data = (const uint8 *) _data;
    const uint8 first = *data;
    while (item != NULL)
    {
        const size_t itemremain = item->bytes - ((size_t)(ptr-item->data));
        ptr = (uint8 *) memchr(ptr, first, itemremain);
        while (ptr != NULL)
        {
            const size_t retval = pos + ((size_t) (ptr - item->data));
            if (len == 1)
                return retval;  // we're done, here it is!

            const size_t itemremain = item->bytes - ((size_t)(ptr-item->data));
            const size_t avail = len < itemremain ? len : itemremain;
            if ((avail == 0) || (memcmp(ptr, data, avail) == 0))
            {
                // okay, we've got a (sub)string match! Move to the next block.
                // check all blocks until we get a complete match or a failure.
                if (blockscmp(item->next, data+avail, len-avail))
                    return (ssize_t) retval;
            } // if

            // try again, further in this block.
            ptr = (uint8 *) memchr(ptr + 1, first, itemremain - 1);
        } // while

        pos += item->bytes;
        item = item->next;
        if (item != NULL)
            ptr = item->data;
    } // while

    return -1;  // no match found.
}